

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alSourceQueueBuffers(ALuint name,ALsizei nb,ALuint *bufnames)

{
  int local_1c;
  ALsizei i;
  ALuint *bufnames_local;
  ALsizei nb_local;
  ALuint name_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSourceQueueBuffers);
  IO_UINT32(name);
  IO_ALSIZEI(nb);
  IO_PTR(bufnames);
  for (local_1c = 0; local_1c < nb; local_1c = local_1c + 1) {
    IO_UINT32(bufnames[local_1c]);
  }
  (*REAL_alSourceQueueBuffers)(name,nb,bufnames);
  check_source_state_from_name(name);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSourceQueueBuffers(ALuint name, ALsizei nb, const ALuint *bufnames)
{
    ALsizei i;
    IO_START(alSourceQueueBuffers);
    IO_UINT32(name);
    IO_ALSIZEI(nb);
    IO_PTR(bufnames);
    for (i = 0; i < nb; i++) {
        IO_UINT32(bufnames[i]);
    }

    REAL_alSourceQueueBuffers(name, nb, bufnames);

    check_source_state_from_name(name);

    IO_END();
}